

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int encode_without_recode(AV1_COMP *cpi)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  RefCntBuffer *pRVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  uint8_t *puVar7;
  YV12_BUFFER_CONFIG *pYVar8;
  AV1_COMP *in_RDI;
  int in_stack_00000008;
  AV1_COMP *in_stack_00000010;
  SequenceHeader *seq_params_1;
  int scale_references;
  YV12_BUFFER_CONFIG *ref_1;
  YV12_BUFFER_CONFIG *ref;
  int current_size;
  SPEED_FEATURES *sf;
  SequenceHeader *seq_params;
  int phase_scaler;
  InterpFilter filter_scaler;
  YV12_BUFFER_CONFIG *unscaled;
  int q;
  int bottom_index;
  int top_index;
  int resize_pending;
  SVC *svc;
  QuantizationCfg *q_cfg;
  AV1_COMMON *cm;
  AV1_COMP *in_stack_000000c0;
  int in_stack_ffffffffffffff5c;
  undefined4 in_stack_ffffffffffffff60;
  aom_tune_metric aVar9;
  undefined4 in_stack_ffffffffffffff64;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  MV_REFERENCE_FRAME ref_frame;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  int in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  aom_bit_depth_t bit_depth;
  CommonQuantParams *in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff94;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff98;
  AV1_COMP *in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  AV1_COMP *in_stack_ffffffffffffffb0;
  AV1_COMP *cpi_00;
  aom_tune_metric in_stack_ffffffffffffffb8;
  undefined1 in_stack_ffffffffffffffc5;
  undefined1 in_stack_ffffffffffffffc6;
  undefined1 use_optimized_scaler;
  int border;
  undefined4 uVar10;
  int byte_alignment;
  AV1_COMP *cpi_01;
  QuantizationCfg *pQVar11;
  AV1_COMP *cpi_02;
  
  cpi_02 = (AV1_COMP *)&in_RDI->common;
  pQVar11 = &(in_RDI->oxcf).q_cfg;
  cpi_01 = (AV1_COMP *)&in_RDI->svc;
  iVar1 = is_frame_resize_pending(in_RDI);
  byte_alignment = 0;
  uVar10 = 0;
  border = 0;
  pYVar8 = in_RDI->unscaled_source;
  if (in_RDI->ppi->use_svc == 0) {
    bit_depth = 1;
  }
  else {
    iVar4._0_1_ = *(FRAME_TYPE *)&cpi_01->ppi;
    iVar4._1_1_ = *(REFERENCE_MODE *)((long)&cpi_01->ppi + 1);
    iVar4._2_2_ = *(undefined2 *)((long)&cpi_01->ppi + 2);
    bit_depth = (aom_bit_depth_t)
                *(byte *)((long)(cpi_01->enc_quant_dequant_params).quants.y_quant[0x15] +
                         (long)iVar4 + 4);
  }
  use_optimized_scaler = (undefined1)bit_depth;
  if (in_RDI->ppi->use_svc == 0) {
    iVar4 = 0;
  }
  else {
    iVar2._0_1_ = *(FRAME_TYPE *)&cpi_01->ppi;
    iVar2._1_1_ = *(REFERENCE_MODE *)((long)&cpi_01->ppi + 1);
    iVar2._2_2_ = *(undefined2 *)((long)&cpi_01->ppi + 2);
    iVar4 = *(int *)((long)(cpi_01->enc_quant_dequant_params).quants.y_quant[0x15] +
                    ((long)iVar2 + 2) * 4);
  }
  if (((in_RDI->rc).postencode_drop != 0) &&
     (iVar2 = allow_postencode_drop_rtc
                        ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60)),
     iVar2 != 0)) {
    av1_save_all_coding_context((AV1_COMP *)0x24bc36);
  }
  set_size_independent_vars
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  av1_setup_frame_size((AV1_COMP *)CONCAT44(bit_depth,iVar4));
  pRVar5 = get_primary_ref_frame_buf
                     ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
  ref_frame = (MV_REFERENCE_FRAME)((uint)in_stack_ffffffffffffff6c >> 0x18);
  *(RefCntBuffer **)(cpi_02->enc_quant_dequant_params).quants.y_quant[0xd] = pRVar5;
  av1_set_size_dependent_vars
            (in_stack_ffffffffffffffb0,
             (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             (int *)in_stack_ffffffffffffffa0,(int *)in_stack_ffffffffffffff98);
  av1_set_mv_search_params((AV1_COMP *)CONCAT44(bit_depth,iVar4));
  if ((*(uint *)(cpi_02->enc_quant_dequant_params).quants.y_quant[0] == 0) &&
     (((in_RDI->ppi->use_svc != 0 || (0 < (in_RDI->oxcf).rc_cfg.drop_frames_water_mark)) &&
      ((in_RDI->svc).temporal_layer_id == 0)))) {
    in_stack_ffffffffffffffb8 =
         (aom_tune_metric)
         *(undefined8 *)((cpi_02->enc_quant_dequant_params).quants.v_quant_fp[7] + 4);
    in_stack_ffffffffffffff60 =
         *(undefined4 *)(cpi_02->enc_quant_dequant_params).quants.y_quant[0x1f];
    in_stack_ffffffffffffff70 = 0;
    iVar2 = aom_alloc_frame_buffer
                      ((YV12_BUFFER_CONFIG *)in_stack_ffffffffffffffa0,
                       (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                       (int)in_stack_ffffffffffffff98,in_stack_ffffffffffffff94,
                       in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                       border,byte_alignment,SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0),
                       (int)pQVar11);
    if (iVar2 != 0) {
      aom_internal_error(*(aom_internal_error_info **)
                          (cpi_02->enc_quant_dequant_params).quants.y_quant[2],AOM_CODEC_MEM_ERROR,
                         "Failed to allocate buffer for source_last_TL0");
    }
  }
  if (in_RDI->ppi->use_svc == 0) {
    if ((*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 4) << 1 ==
         (pYVar8->field_2).field_0.y_crop_width) &&
       (*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 6) << 1 ==
        (pYVar8->field_3).field_0.y_crop_height)) {
      use_optimized_scaler = 3;
      if (*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 4) *
          *(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 6) < 0xe101) {
        use_optimized_scaler = 1;
      }
    }
    else if ((*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 4) << 2 ==
              (pYVar8->field_2).field_0.y_crop_width) &&
            (*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 6) << 2 ==
             (pYVar8->field_3).field_0.y_crop_height)) {
      use_optimized_scaler = 1;
    }
    else if ((*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 4) << 2 ==
              (pYVar8->field_2).field_0.y_crop_width * 3) &&
            (*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 6) << 2 ==
             (pYVar8->field_3).field_0.y_crop_height * 3)) {
      use_optimized_scaler = 0;
    }
  }
  allocate_gradient_info_for_hog
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  allocate_src_var_of_4x4_sub_block_buf
            ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  cpi_00 = (AV1_COMP *)&in_RDI->sf;
  if ((in_RDI->sf).part_sf.partition_search_type == '\x02') {
    variance_partition_alloc
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  if ((((CurrentFrame *)&cpi_02->ppi)->frame_type == '\0') ||
     ((*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x26] + 4) != 0 &&
      (((in_RDI->refresh_frame).golden_frame & 1U) != 0)))) {
    copy_frame_prob_info((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  }
  iVar2 = (in_RDI->oxcf).border_in_pixels;
  pYVar6 = av1_realloc_and_scale_if_required
                     ((AV1_COMMON *)cpi_01,(YV12_BUFFER_CONFIG *)CONCAT44(iVar1,byte_alignment),
                      (YV12_BUFFER_CONFIG *)CONCAT44(uVar10,border),
                      (InterpFilter)((ulong)pYVar8 >> 0x38),(int)pYVar8,(_Bool)use_optimized_scaler,
                      (_Bool)in_stack_ffffffffffffffc6,in_stack_00000008,
                      (_Bool)in_stack_ffffffffffffffc5);
  in_RDI->source = pYVar6;
  iVar3 = frame_is_intra_only((AV1_COMMON *)cpi_02);
  if ((iVar3 != 0) || (iVar1 != 0)) {
    iVar3 = *(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[0x20] + 2) *
            *(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[0x20] + 4) >> 2;
    if ((in_RDI->consec_zero_mv != (uint8_t *)0x0) && (in_RDI->consec_zero_mv_alloc_size < iVar3)) {
      aom_free((void *)CONCAT44(in_stack_ffffffffffffff64,iVar2));
      in_RDI->consec_zero_mv_alloc_size = 0;
      puVar7 = (uint8_t *)aom_malloc(0x24c046);
      in_RDI->consec_zero_mv = puVar7;
      if (in_RDI->consec_zero_mv == (uint8_t *)0x0) {
        aom_internal_error(*(aom_internal_error_info **)
                            (cpi_02->enc_quant_dequant_params).quants.y_quant[2],AOM_CODEC_MEM_ERROR
                           ,"Failed to allocate cpi->consec_zero_mv");
      }
      in_RDI->consec_zero_mv_alloc_size = iVar3;
    }
    memset(in_RDI->consec_zero_mv,0,(long)iVar3);
  }
  if (in_RDI->scaled_last_source_available == 0) {
    if (in_RDI->unscaled_last_source != (YV12_BUFFER_CONFIG *)0x0) {
      pYVar8 = av1_realloc_and_scale_if_required
                         ((AV1_COMMON *)cpi_01,(YV12_BUFFER_CONFIG *)CONCAT44(iVar1,byte_alignment),
                          (YV12_BUFFER_CONFIG *)CONCAT44(uVar10,border),
                          (InterpFilter)((ulong)pYVar8 >> 0x38),(int)pYVar8,
                          (_Bool)use_optimized_scaler,(_Bool)in_stack_ffffffffffffffc6,
                          in_stack_00000008,(_Bool)in_stack_ffffffffffffffc5);
      in_RDI->last_source = pYVar8;
    }
  }
  else {
    in_RDI->last_source = &in_RDI->scaled_last_source;
    in_RDI->scaled_last_source_available = 0;
  }
  if ((in_RDI->sf).rt_sf.use_temporal_noise_estimate != 0) {
    av1_update_noise_estimate(in_stack_000000c0);
  }
  if (*(uint *)&cpi_01->field_0x8 == 1) {
    if (((((in_RDI->oxcf).superres_cfg.enable_superres & 1U) == 0) &&
        ((in_RDI->ref_frame_flags & 8U) != 0)) &&
       ((in_stack_ffffffffffffffa0 =
              (AV1_COMP *)
              get_ref_frame_yv12_buf
                        ((AV1_COMMON *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70)
                         ,ref_frame), in_stack_ffffffffffffffa0 == (AV1_COMP *)0x0 ||
        (((((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)
           &in_stack_ffffffffffffffa0->enc_quant_dequant_params)->field_0).y_crop_width !=
          *(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 4) ||
         ((((anon_union_8_2_abde48f3_for_yv12_buffer_config_6 *)
           ((anon_union_8_2_5af33bd4_for_yv12_buffer_config_4 *)
            &in_stack_ffffffffffffffa0->enc_quant_dequant_params + 1))->field_0).y_crop_height !=
          *(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 6))))))) {
      in_RDI->ref_frame_flags = in_RDI->ref_frame_flags ^ 8;
    }
    if (((in_RDI->ref_frame_flags & 0x40U) != 0) &&
       (((in_stack_ffffffffffffff98 =
               get_ref_frame_yv12_buf
                         ((AV1_COMMON *)
                          CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),ref_frame),
         in_stack_ffffffffffffff98 == (YV12_BUFFER_CONFIG *)0x0 ||
         ((in_stack_ffffffffffffff98->field_2).field_0.y_crop_width !=
          *(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 4))) ||
        ((in_stack_ffffffffffffff98->field_3).field_0.y_crop_height !=
         *(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 6))))) {
      in_RDI->ref_frame_flags = in_RDI->ref_frame_flags ^ 0x40;
    }
  }
  iVar2 = 0;
  if (((in_RDI->ppi->gf_group).frame_parallel_level[in_RDI->gf_frame_index] == 0) &&
     (iVar3 = frame_is_intra_only((AV1_COMMON *)cpi_02), iVar3 == 0)) {
    av1_scale_references
              (cpi_02,(InterpFilter)((ulong)pQVar11 >> 0x38),(int)pQVar11,
               (int)((ulong)cpi_01 >> 0x20));
  }
  aVar9 = (in_RDI->oxcf).tune_cfg.tuning;
  av1_set_quantizer((AV1_COMMON *)in_stack_ffffffffffffffa0,
                    (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98,
                    iVar2,in_stack_ffffffffffffff90,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                    SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0),in_stack_ffffffffffffffb8);
  av1_set_speed_features_qindex_dependent((AV1_COMP *)ref_1,scale_references);
  av1_init_quantizer((EncQuantDequantParams *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                     in_stack_ffffffffffffff88,bit_depth,iVar4);
  av1_set_variance_partition_thresholds
            ((AV1_COMP *)CONCAT44(bit_depth,iVar4),in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78);
  av1_setup_frame((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if ((((in_RDI->sf).rt_sf.overshoot_detection_cbr == '\x01') && ((in_RDI->rc).high_source_sad != 0)
      ) && (iVar1 = av1_encodedframe_overshoot_cbr(cpi_01,(int *)CONCAT44(iVar1,byte_alignment)),
           iVar1 != 0)) {
    aVar9 = (in_RDI->oxcf).tune_cfg.tuning;
    av1_set_quantizer((AV1_COMMON *)in_stack_ffffffffffffffa0,
                      (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),(int)in_stack_ffffffffffffff98
                      ,iVar2,in_stack_ffffffffffffff90,
                      (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),
                      SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0),in_stack_ffffffffffffffb8);
    av1_set_speed_features_qindex_dependent((AV1_COMP *)ref_1,scale_references);
    av1_init_quantizer((EncQuantDequantParams *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                       in_stack_ffffffffffffff88,bit_depth,iVar4);
    av1_set_variance_partition_thresholds
              ((AV1_COMP *)CONCAT44(bit_depth,iVar4),in_stack_ffffffffffffff7c,
               in_stack_ffffffffffffff78);
    iVar1 = frame_is_intra_only((AV1_COMMON *)cpi_02);
    if (((iVar1 != 0) || (((cpi_02->enc_quant_dequant_params).quants.y_quant[0x1e][3] & 1) != 0)) ||
       (*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[0x1e] + 6) == 7)) {
      av1_setup_frame((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
    }
  }
  av1_apply_active_map((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70));
  if (pQVar11->aq_mode == '\x03') {
    av1_cyclic_refresh_setup(in_stack_00000010);
  }
  iVar1 = (int)pQVar11;
  if ((char)(cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2][4] == '\0') {
    memset((cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4,0,0xac);
  }
  else if (((char)(cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2][5] == '\0') &&
          (*(long *)(cpi_02->enc_quant_dequant_params).quants.y_quant[0xd] != 0)) {
    segfeatures_copy((segmentation *)
                     ((cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4),
                     (segmentation *)
                     (*(long *)(cpi_02->enc_quant_dequant_params).quants.y_quant[0xd] + 0x58));
    *(undefined1 *)((cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4) =
         *(undefined1 *)(*(long *)(cpi_02->enc_quant_dequant_params).quants.y_quant[0xd] + 0x58);
  }
  else {
    av1_calculate_segdata
              ((segmentation *)((cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4));
  }
  segfeatures_copy((segmentation *)
                   (*(long *)((cpi_02->enc_quant_dequant_params).quants.y_quant[0xd] + 4) + 0x58),
                   (segmentation *)((cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2] + 4))
  ;
  *(char *)(*(long *)((cpi_02->enc_quant_dequant_params).quants.y_quant[0xd] + 4) + 0x58) =
       (char)(cpi_02->enc_quant_dequant_params).quants.y_quant_fp[0xa2][4];
  iVar4 = is_psnr_calc_enabled((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,aVar9));
  if ((iVar4 != 0) && ((in_RDI->sf).rt_sf.use_rtc_tf != 0)) {
    in_stack_ffffffffffffff88 =
         *(CommonQuantParams **)((cpi_02->enc_quant_dequant_params).quants.v_quant_fp[7] + 4);
    if (((in_RDI->orig_source).buffer_alloc_sz == 0) ||
       (((in_RDI->rc).prev_coded_width != (in_RDI->oxcf).frm_dim_cfg.width ||
        ((in_RDI->rc).prev_coded_height != (in_RDI->oxcf).frm_dim_cfg.height)))) {
      aVar9 = *(aom_tune_metric *)(cpi_02->enc_quant_dequant_params).quants.y_quant[0x1f];
      iVar1 = aom_alloc_frame_buffer
                        ((YV12_BUFFER_CONFIG *)in_stack_ffffffffffffffa0,
                         (int)((ulong)in_stack_ffffffffffffff98 >> 0x20),
                         (int)in_stack_ffffffffffffff98,iVar2,in_stack_ffffffffffffff90,
                         (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),border,byte_alignment,
                         SUB81((ulong)in_stack_ffffffffffffff88 >> 0x18,0),iVar1);
      if (iVar1 != 0) {
        aom_internal_error(*(aom_internal_error_info **)
                            (cpi_02->enc_quant_dequant_params).quants.y_quant[2],AOM_CODEC_MEM_ERROR
                           ,"Failed to allocate scaled buffer");
      }
    }
    aom_yv12_copy_y_c((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                      (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff88,bit_depth);
    aom_yv12_copy_u_c((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                      (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff88,bit_depth);
    aom_yv12_copy_v_c((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                      (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff88,bit_depth);
  }
  iVar1 = frame_is_intra_only((AV1_COMMON *)cpi_02);
  if (iVar1 == 0) {
    av1_pick_and_set_high_precision_mv
              ((AV1_COMP *)CONCAT44(in_stack_ffffffffffffff64,aVar9),in_stack_ffffffffffffff5c);
  }
  av1_encode_frame(cpi_00);
  if (((in_RDI->rc).rtc_external_ratectrl == 0) &&
     (iVar1 = frame_is_intra_only((AV1_COMMON *)cpi_02), iVar1 == 0)) {
    update_motion_stat(in_RDI);
  }
  iVar1 = frame_is_intra_only((AV1_COMMON *)cpi_02);
  if (((((iVar1 == 0) && ((in_RDI->oxcf).rc_cfg.mode == AOM_CBR)) && ((in_RDI->oxcf).mode == '\x01')
       ) && ((*(int *)&cpi_01->field_0x8 == 1 && (*(int *)&cpi_01->field_0xc == 1)))) &&
     (((in_RDI->rc).rtc_external_ratectrl == 0 &&
      (((in_RDI->ppi->rtc_ref).set_ref_frame_config == 0 &&
       (*(int *)((cpi_00->enc_quant_dequant_params).quants.y_quant[0x4c] + 2) != 0)))))) {
    av1_adjust_gf_refresh_qp_one_pass_rt(in_stack_ffffffffffffffa0);
  }
  if ((((1 < *(uint *)(cpi_02->enc_quant_dequant_params).quants.y_quant[0]) &&
       (in_RDI->ppi->use_svc == 0)) &&
      ((in_RDI->scaled_source).field_5.field_0.y_buffer != (uint8_t *)0x0)) &&
     ((((in_RDI->scaled_last_source).field_5.field_0.y_buffer != (uint8_t *)0x0 &&
       ((in_RDI->scaled_source).field_2.field_0.y_crop_width ==
        (in_RDI->scaled_last_source).field_2.field_0.y_crop_width)) &&
      (((in_RDI->scaled_source).field_3.field_0.y_crop_height ==
        (in_RDI->scaled_last_source).field_3.field_0.y_crop_height &&
       ((*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 4) !=
         (in_RDI->unscaled_source->field_2).field_0.y_crop_width ||
        (*(int *)((cpi_02->enc_quant_dequant_params).quants.y_quant[2] + 6) !=
         (in_RDI->unscaled_source->field_3).field_0.y_crop_height)))))))) {
    in_RDI->scaled_last_source_available = 1;
    aom_yv12_copy_y_c((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                      (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff88,bit_depth);
    aom_yv12_copy_u_c((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                      (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff88,bit_depth);
    aom_yv12_copy_v_c((YV12_BUFFER_CONFIG *)CONCAT44(iVar2,in_stack_ffffffffffffff90),
                      (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff88,bit_depth);
  }
  return 0;
}

Assistant:

static int encode_without_recode(AV1_COMP *cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const QuantizationCfg *const q_cfg = &cpi->oxcf.q_cfg;
  SVC *const svc = &cpi->svc;
  const int resize_pending = is_frame_resize_pending(cpi);
  int top_index = 0, bottom_index = 0, q = 0;
  YV12_BUFFER_CONFIG *unscaled = cpi->unscaled_source;
  InterpFilter filter_scaler =
      cpi->ppi->use_svc ? svc->downsample_filter_type[svc->spatial_layer_id]
                        : EIGHTTAP_SMOOTH;
  int phase_scaler = cpi->ppi->use_svc
                         ? svc->downsample_filter_phase[svc->spatial_layer_id]
                         : 0;

  if (cpi->rc.postencode_drop && allow_postencode_drop_rtc(cpi))
    av1_save_all_coding_context(cpi);

  set_size_independent_vars(cpi);
  av1_setup_frame_size(cpi);
  cm->prev_frame = get_primary_ref_frame_buf(cm);
  av1_set_size_dependent_vars(cpi, &q, &bottom_index, &top_index);
  av1_set_mv_search_params(cpi);

  if (cm->current_frame.frame_number == 0 &&
      (cpi->ppi->use_svc || cpi->oxcf.rc_cfg.drop_frames_water_mark > 0) &&
      cpi->svc.temporal_layer_id == 0) {
    const SequenceHeader *seq_params = cm->seq_params;
    if (aom_alloc_frame_buffer(
            &cpi->svc.source_last_TL0, cpi->oxcf.frm_dim_cfg.width,
            cpi->oxcf.frm_dim_cfg.height, seq_params->subsampling_x,
            seq_params->subsampling_y, seq_params->use_highbitdepth,
            cpi->oxcf.border_in_pixels, cm->features.byte_alignment, false,
            0)) {
      aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                         "Failed to allocate buffer for source_last_TL0");
    }
  }

  if (!cpi->ppi->use_svc) {
    phase_scaler = 8;
    // 2:1 scaling.
    if ((cm->width << 1) == unscaled->y_crop_width &&
        (cm->height << 1) == unscaled->y_crop_height) {
      filter_scaler = BILINEAR;
      // For lower resolutions use eighttap_smooth.
      if (cm->width * cm->height <= 320 * 180) filter_scaler = EIGHTTAP_SMOOTH;
    } else if ((cm->width << 2) == unscaled->y_crop_width &&
               (cm->height << 2) == unscaled->y_crop_height) {
      // 4:1 scaling.
      filter_scaler = EIGHTTAP_SMOOTH;
    } else if ((cm->width << 2) == 3 * unscaled->y_crop_width &&
               (cm->height << 2) == 3 * unscaled->y_crop_height) {
      // 4:3 scaling.
      filter_scaler = EIGHTTAP_REGULAR;
    }
  }

  allocate_gradient_info_for_hog(cpi);

  allocate_src_var_of_4x4_sub_block_buf(cpi);

  const SPEED_FEATURES *sf = &cpi->sf;
  if (sf->part_sf.partition_search_type == VAR_BASED_PARTITION)
    variance_partition_alloc(cpi);

  if (cm->current_frame.frame_type == KEY_FRAME ||
      ((sf->inter_sf.extra_prune_warped && cpi->refresh_frame.golden_frame)))
    copy_frame_prob_info(cpi);

#if CONFIG_COLLECT_COMPONENT_TIMING
  printf("\n Encoding a frame: \n");
#endif

#if CONFIG_TUNE_BUTTERAUGLI
  if (cpi->oxcf.tune_cfg.tuning == AOM_TUNE_BUTTERAUGLI) {
    av1_setup_butteraugli_rdmult(cpi);
  }
#endif

  cpi->source = av1_realloc_and_scale_if_required(
      cm, unscaled, &cpi->scaled_source, filter_scaler, phase_scaler, true,
      false, cpi->oxcf.border_in_pixels, cpi->alloc_pyramid);
  if (frame_is_intra_only(cm) || resize_pending != 0) {
    const int current_size =
        (cm->mi_params.mi_rows * cm->mi_params.mi_cols) >> 2;
    if (cpi->consec_zero_mv &&
        (cpi->consec_zero_mv_alloc_size < current_size)) {
      aom_free(cpi->consec_zero_mv);
      cpi->consec_zero_mv_alloc_size = 0;
      CHECK_MEM_ERROR(cm, cpi->consec_zero_mv,
                      aom_malloc(current_size * sizeof(*cpi->consec_zero_mv)));
      cpi->consec_zero_mv_alloc_size = current_size;
    }
    assert(cpi->consec_zero_mv != NULL);
    memset(cpi->consec_zero_mv, 0, current_size * sizeof(*cpi->consec_zero_mv));
  }

  if (cpi->scaled_last_source_available) {
    cpi->last_source = &cpi->scaled_last_source;
    cpi->scaled_last_source_available = 0;
  } else if (cpi->unscaled_last_source != NULL) {
    cpi->last_source = av1_realloc_and_scale_if_required(
        cm, cpi->unscaled_last_source, &cpi->scaled_last_source, filter_scaler,
        phase_scaler, true, false, cpi->oxcf.border_in_pixels,
        cpi->alloc_pyramid);
  }

  if (cpi->sf.rt_sf.use_temporal_noise_estimate) {
    av1_update_noise_estimate(cpi);
  }

#if CONFIG_AV1_TEMPORAL_DENOISING
  if (cpi->oxcf.noise_sensitivity > 0 && cpi->ppi->use_svc)
    av1_denoiser_reset_on_first_frame(cpi);
#endif

  // For 1 spatial layer encoding: if the (non-LAST) reference has different
  // resolution from the source then disable that reference. This is to avoid
  // significant increase in encode time from scaling the references in
  // av1_scale_references. Note GOLDEN is forced to update on the (first/tigger)
  // resized frame and ALTREF will be refreshed ~4 frames later, so both
  // references become available again after few frames.
  // For superres: don't disable golden reference.
  if (svc->number_spatial_layers == 1) {
    if (!cpi->oxcf.superres_cfg.enable_superres) {
      if (cpi->ref_frame_flags & av1_ref_frame_flag_list[GOLDEN_FRAME]) {
        const YV12_BUFFER_CONFIG *const ref =
            get_ref_frame_yv12_buf(cm, GOLDEN_FRAME);
        if (ref == NULL || ref->y_crop_width != cm->width ||
            ref->y_crop_height != cm->height) {
          cpi->ref_frame_flags ^= AOM_GOLD_FLAG;
        }
      }
    }
    if (cpi->ref_frame_flags & av1_ref_frame_flag_list[ALTREF_FRAME]) {
      const YV12_BUFFER_CONFIG *const ref =
          get_ref_frame_yv12_buf(cm, ALTREF_FRAME);
      if (ref == NULL || ref->y_crop_width != cm->width ||
          ref->y_crop_height != cm->height) {
        cpi->ref_frame_flags ^= AOM_ALT_FLAG;
      }
    }
  }

  int scale_references = 0;
#if CONFIG_FPMT_TEST
  scale_references =
      cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE ? 1 : 0;
#endif  // CONFIG_FPMT_TEST
  if (scale_references ||
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 0) {
    if (!frame_is_intra_only(cm)) {
      av1_scale_references(cpi, filter_scaler, phase_scaler, 1);
    }
  }

  av1_set_quantizer(cm, q_cfg->qm_minlevel, q_cfg->qm_maxlevel, q,
                    q_cfg->enable_chroma_deltaq, q_cfg->enable_hdr_deltaq,
                    cpi->oxcf.mode == ALLINTRA, cpi->oxcf.tune_cfg.tuning);
  av1_set_speed_features_qindex_dependent(cpi, cpi->oxcf.speed);
  av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                     cm->seq_params->bit_depth, cpi->oxcf.algo_cfg.sharpness);
  av1_set_variance_partition_thresholds(cpi, q, 0);
  av1_setup_frame(cpi);

  // Check if this high_source_sad (scene/slide change) frame should be
  // encoded at high/max QP, and if so, set the q and adjust some rate
  // control parameters.
  if (cpi->sf.rt_sf.overshoot_detection_cbr == FAST_DETECTION_MAXQ &&
      cpi->rc.high_source_sad) {
    if (av1_encodedframe_overshoot_cbr(cpi, &q)) {
      av1_set_quantizer(cm, q_cfg->qm_minlevel, q_cfg->qm_maxlevel, q,
                        q_cfg->enable_chroma_deltaq, q_cfg->enable_hdr_deltaq,
                        cpi->oxcf.mode == ALLINTRA, cpi->oxcf.tune_cfg.tuning);
      av1_set_speed_features_qindex_dependent(cpi, cpi->oxcf.speed);
      av1_init_quantizer(&cpi->enc_quant_dequant_params, &cm->quant_params,
                         cm->seq_params->bit_depth,
                         cpi->oxcf.algo_cfg.sharpness);
      av1_set_variance_partition_thresholds(cpi, q, 0);
      if (frame_is_intra_only(cm) || cm->features.error_resilient_mode ||
          cm->features.primary_ref_frame == PRIMARY_REF_NONE)
        av1_setup_frame(cpi);
    }
  }
  av1_apply_active_map(cpi);
  if (q_cfg->aq_mode == CYCLIC_REFRESH_AQ) av1_cyclic_refresh_setup(cpi);
  if (cm->seg.enabled) {
    if (!cm->seg.update_data && cm->prev_frame) {
      segfeatures_copy(&cm->seg, &cm->prev_frame->seg);
      cm->seg.enabled = cm->prev_frame->seg.enabled;
    } else {
      av1_calculate_segdata(&cm->seg);
    }
  } else {
    memset(&cm->seg, 0, sizeof(cm->seg));
  }
  segfeatures_copy(&cm->cur_frame->seg, &cm->seg);
  cm->cur_frame->seg.enabled = cm->seg.enabled;

  // This is for rtc temporal filtering case.
  if (is_psnr_calc_enabled(cpi) && cpi->sf.rt_sf.use_rtc_tf) {
    const SequenceHeader *seq_params = cm->seq_params;

    if (cpi->orig_source.buffer_alloc_sz == 0 ||
        cpi->rc.prev_coded_width != cpi->oxcf.frm_dim_cfg.width ||
        cpi->rc.prev_coded_height != cpi->oxcf.frm_dim_cfg.height) {
      // Allocate a source buffer to store the true source for psnr calculation.
      if (aom_alloc_frame_buffer(
              &cpi->orig_source, cpi->oxcf.frm_dim_cfg.width,
              cpi->oxcf.frm_dim_cfg.height, seq_params->subsampling_x,
              seq_params->subsampling_y, seq_params->use_highbitdepth,
              cpi->oxcf.border_in_pixels, cm->features.byte_alignment, false,
              0))
        aom_internal_error(cm->error, AOM_CODEC_MEM_ERROR,
                           "Failed to allocate scaled buffer");
    }

    aom_yv12_copy_y(cpi->source, &cpi->orig_source, 1);
    aom_yv12_copy_u(cpi->source, &cpi->orig_source, 1);
    aom_yv12_copy_v(cpi->source, &cpi->orig_source, 1);
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, av1_encode_frame_time);
#endif

  // Set the motion vector precision based on mv stats from the last coded
  // frame.
  if (!frame_is_intra_only(cm)) av1_pick_and_set_high_precision_mv(cpi, q);

  // transform / motion compensation build reconstruction frame
  av1_encode_frame(cpi);

  if (!cpi->rc.rtc_external_ratectrl && !frame_is_intra_only(cm))
    update_motion_stat(cpi);

  // Adjust the refresh of the golden (longer-term) reference based on QP
  // selected for this frame. This is for CBR real-time mode, and only
  // for single layer without usage of the set_ref_frame_config (so
  // reference structure for 1 layer is set internally).
  if (!frame_is_intra_only(cm) && cpi->oxcf.rc_cfg.mode == AOM_CBR &&
      cpi->oxcf.mode == REALTIME && svc->number_spatial_layers == 1 &&
      svc->number_temporal_layers == 1 && !cpi->rc.rtc_external_ratectrl &&
      !cpi->ppi->rtc_ref.set_ref_frame_config &&
      sf->rt_sf.gf_refresh_based_on_qp)
    av1_adjust_gf_refresh_qp_one_pass_rt(cpi);

  // For non-svc: if scaling is required, copy scaled_source
  // into scaled_last_source.
  if (cm->current_frame.frame_number > 1 && !cpi->ppi->use_svc &&
      cpi->scaled_source.y_buffer != NULL &&
      cpi->scaled_last_source.y_buffer != NULL &&
      cpi->scaled_source.y_crop_width == cpi->scaled_last_source.y_crop_width &&
      cpi->scaled_source.y_crop_height ==
          cpi->scaled_last_source.y_crop_height &&
      (cm->width != cpi->unscaled_source->y_crop_width ||
       cm->height != cpi->unscaled_source->y_crop_height)) {
    cpi->scaled_last_source_available = 1;
    aom_yv12_copy_y(&cpi->scaled_source, &cpi->scaled_last_source, 1);
    aom_yv12_copy_u(&cpi->scaled_source, &cpi->scaled_last_source, 1);
    aom_yv12_copy_v(&cpi->scaled_source, &cpi->scaled_last_source, 1);
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, av1_encode_frame_time);
#endif
#if CONFIG_INTERNAL_STATS
  ++cpi->frame_recode_hits;
#endif

  return AOM_CODEC_OK;
}